

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t mime_file_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  int iVar1;
  size_t sVar2;
  undefined8 uStack_30;
  
  if (nitems == 0) {
    uStack_30 = 0xfffffffffffffffe;
  }
  else {
    iVar1 = mime_open_file((curl_mimepart *)instream);
    if (iVar1 == 0) {
      sVar2 = fread(buffer,size,nitems,*(FILE **)((long)instream + 0x48));
      return sVar2;
    }
    uStack_30 = 0xffffffffffffffff;
  }
  return uStack_30;
}

Assistant:

static size_t mime_file_read(char *buffer, size_t size, size_t nitems,
                             void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;

  if(!nitems)
    return STOP_FILLING;

  if(mime_open_file(part))
    return READ_ERROR;

  return fread(buffer, size, nitems, part->fp);
}